

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  int64_t iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  SquareMatrix<std::complex<double>_> *pSVar3;
  complex<double> val;
  complex<double> val_00;
  complex<double> val_01;
  complex<double> val_02;
  SquareMatrix<std::complex<double>_> *mat_local;
  
  iVar1 = dense::SquareMatrix<std::complex<double>_>::rows(mat);
  if (iVar1 != 2) {
    __assert_fail("mat.rows() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                  ,0x61,
                  "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
                 );
  }
  iVar1 = dense::SquareMatrix<std::complex<double>_>::cols(mat);
  if (iVar1 == 2) {
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,0);
    val._M_value._8_8_ = extraout_RDX;
    val._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val);
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,1);
    val_00._M_value._8_8_ = extraout_RDX_00;
    val_00._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_00);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uVar2 = 1;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,0);
    val_01._M_value._8_8_ = extraout_RDX_01;
    val_01._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_01);
    uVar2 = 1;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,1);
    val_02._M_value._8_8_ = extraout_RDX_02;
    val_02._M_value._0_8_ = uVar2;
    print<double>((qclab *)mat,val_02);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("mat.cols() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x62,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }